

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt,xmlAttrPtr attr)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlSchemaTypePtr pxVar3;
  int res;
  xmlChar *strip;
  xmlChar *value;
  int ret;
  xmlAttrPtr attr_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (attr == (xmlAttrPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    strip = xmlSchemaGetNodeContentNoDict((xmlNodePtr)attr);
    value._4_4_ = xmlValidateNCName(strip,1);
    if (value._4_4_ == 0) {
      if (attr->atype != XML_ATTRIBUTE_ID) {
        pxVar2 = xmlSchemaCollapseString(strip);
        if (pxVar2 != (xmlChar *)0x0) {
          (*xmlFree)(strip);
          strip = pxVar2;
        }
        iVar1 = xmlAddIDSafe(attr,strip);
        if (iVar1 < 0) {
          xmlSchemaPErrMemory(ctxt);
        }
        else if (iVar1 == 0) {
          value._4_4_ = 0xbdd;
          pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,
                     (xmlNodePtr)attr,pxVar3,(char *)0x0,(xmlChar *)0x0,
                     "Duplicate value \'%s\' of simple type \'xs:ID\'",strip,(xmlChar *)0x0);
        }
      }
    }
    else if (0 < value._4_4_) {
      value._4_4_ = 0xbdd;
      pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
      xmlSchemaPSimpleTypeErr
                (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)attr
                 ,pxVar3,(char *)0x0,(xmlChar *)0x0,
                 "The value \'%s\' of simple type \'xs:ID\' is not a valid \'xs:NCName\'",strip,
                 (xmlChar *)0x0);
    }
    if (strip != (xmlChar *)0x0) {
      (*xmlFree)(strip);
    }
    ctxt_local._4_4_ = value._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt, xmlAttrPtr attr)
{
    int ret;
    const xmlChar *value;

    if (attr == NULL)
	return(0);
    value = xmlSchemaGetNodeContentNoDict((xmlNodePtr) attr);
    ret = xmlValidateNCName(value, 1);
    if (ret == 0) {
	/*
	* NOTE: the IDness might have already be declared in the DTD
	*/
	if (attr->atype != XML_ATTRIBUTE_ID) {
	    xmlChar *strip;
            int res;

	    /*
	    * TODO: Use xmlSchemaStrip here; it's not exported at this
	    * moment.
	    */
	    strip = xmlSchemaCollapseString(value);
	    if (strip != NULL) {
		xmlFree((xmlChar *) value);
		value = strip;
	    }
	    res = xmlAddIDSafe(attr, value);
            if (res < 0) {
                xmlSchemaPErrMemory(ctxt);
	    } else if (res == 0) {
		ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
		    NULL, NULL, "Duplicate value '%s' of simple "
		    "type 'xs:ID'", value, NULL);
	    }
	}
    } else if (ret > 0) {
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
	    NULL, NULL, "The value '%s' of simple type 'xs:ID' is "
	    "not a valid 'xs:NCName'",
	    value, NULL);
    }
    if (value != NULL)
	xmlFree((xmlChar *)value);

    return (ret);
}